

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_addsessionid
                   (Curl_easy *data,connectdata *conn,_Bool isProxy,void *ssl_sessionid,
                   size_t idsize,int sockindex,_Bool *added)

{
  _Bool _Var1;
  ssl_primary_config *source;
  char *pcVar2;
  bool bVar3;
  int local_a0;
  char *local_98;
  char *hostname;
  ssl_primary_config *ssl_config;
  long *general_age;
  char *pcStack_68;
  int conn_to_port;
  char *clone_conn_to_host;
  char *clone_host;
  long oldest_age;
  Curl_ssl_session *store;
  size_t i;
  int sockindex_local;
  size_t idsize_local;
  void *ssl_sessionid_local;
  _Bool isProxy_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (isProxy) {
    source = &conn->proxy_ssl_config;
    local_98 = (conn->http_proxy).host.name;
  }
  else {
    source = &conn->ssl_config;
    local_98 = (conn->host).name;
  }
  if (added != (_Bool *)0x0) {
    *added = false;
  }
  if ((data->state).session == (Curl_ssl_session *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    oldest_age = (long)(data->state).session;
    clone_host = (char *)((data->state).session)->age;
    pcVar2 = (*Curl_cstrdup)(local_98);
    if (pcVar2 == (char *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      if ((*(uint *)&(conn->bits).field_0x4 >> 9 & 1) == 0) {
        pcStack_68 = (char *)0x0;
      }
      else {
        pcStack_68 = (*Curl_cstrdup)((conn->conn_to_host).name);
        if (pcStack_68 == (char *)0x0) {
          (*Curl_cfree)(pcVar2);
          return CURLE_OUT_OF_MEMORY;
        }
      }
      if ((*(uint *)&(conn->bits).field_0x4 >> 10 & 1) == 0) {
        general_age._4_4_ = -1;
      }
      else {
        general_age._4_4_ = conn->conn_to_port;
      }
      if ((data->share == (Curl_share *)0x0) || ((data->share->specifier & 0x10) == 0)) {
        ssl_config = (ssl_primary_config *)&(data->state).sessionage;
      }
      else {
        ssl_config = (ssl_primary_config *)&data->share->sessionage;
      }
      store = (Curl_ssl_session *)0x1;
      while( true ) {
        bVar3 = false;
        if (store < (Curl_ssl_session *)(data->set).general_ssl.max_ssl_sessions) {
          bVar3 = (data->state).session[(long)store].sessionid != (void *)0x0;
        }
        if (!bVar3) break;
        if ((data->state).session[(long)store].age < (long)clone_host) {
          clone_host = (char *)(data->state).session[(long)store].age;
          oldest_age = (long)((data->state).session + (long)store);
        }
        store = (Curl_ssl_session *)((long)&store->name + 1);
      }
      if (store == (Curl_ssl_session *)(data->set).general_ssl.max_ssl_sessions) {
        Curl_ssl_kill_session((Curl_ssl_session *)oldest_age);
      }
      else {
        oldest_age = (long)((data->state).session + (long)store);
      }
      *(void **)(oldest_age + 0x18) = ssl_sessionid;
      *(size_t *)(oldest_age + 0x20) = idsize;
      *(long *)(oldest_age + 0x28) = ssl_config->version;
      (*Curl_cfree)(*(void **)oldest_age);
      (*Curl_cfree)(*(void **)(oldest_age + 8));
      *(char **)oldest_age = pcVar2;
      *(char **)(oldest_age + 8) = pcStack_68;
      *(int *)(oldest_age + 0x34) = general_age._4_4_;
      if (isProxy) {
        local_a0 = conn->port;
      }
      else {
        local_a0 = conn->remote_port;
      }
      *(int *)(oldest_age + 0x30) = local_a0;
      *(char **)(oldest_age + 0x10) = conn->handler->scheme;
      _Var1 = Curl_clone_primary_ssl_config(source,(ssl_primary_config *)(oldest_age + 0x38));
      if (_Var1) {
        if (added != (_Bool *)0x0) {
          *added = true;
        }
        data_local._4_4_ = CURLE_OK;
      }
      else {
        Curl_free_primary_ssl_config((ssl_primary_config *)(oldest_age + 0x38));
        *(undefined8 *)(oldest_age + 0x18) = 0;
        (*Curl_cfree)(pcVar2);
        (*Curl_cfree)(pcStack_68);
        data_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_ssl_addsessionid(struct Curl_easy *data,
                               struct connectdata *conn,
                               const bool isProxy,
                               void *ssl_sessionid,
                               size_t idsize,
                               int sockindex,
                               bool *added)
{
  size_t i;
  struct Curl_ssl_session *store;
  long oldest_age;
  char *clone_host;
  char *clone_conn_to_host;
  int conn_to_port;
  long *general_age;
#ifndef CURL_DISABLE_PROXY
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;
  const char *hostname = isProxy ? conn->http_proxy.host.name :
    conn->host.name;
#else
  struct ssl_primary_config * const ssl_config = &conn->ssl_config;
  const char *hostname = conn->host.name;
#endif
  (void)sockindex;

  if(added)
    *added = FALSE;

  if(!data->state.session)
    return CURLE_OK;

  store = &data->state.session[0];
  oldest_age = data->state.session[0].age; /* zero if unused */
  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  clone_host = strdup(hostname);
  if(!clone_host)
    return CURLE_OUT_OF_MEMORY; /* bail out */

  if(conn->bits.conn_to_host) {
    clone_conn_to_host = strdup(conn->conn_to_host.name);
    if(!clone_conn_to_host) {
      free(clone_host);
      return CURLE_OUT_OF_MEMORY; /* bail out */
    }
  }
  else
    clone_conn_to_host = NULL;

  if(conn->bits.conn_to_port)
    conn_to_port = conn->conn_to_port;
  else
    conn_to_port = -1;

  /* Now we should add the session ID and the host name to the cache, (remove
     the oldest if necessary) */

  /* If using shared SSL session, lock! */
  if(SSLSESSION_SHARED(data)) {
    general_age = &data->share->sessionage;
  }
  else {
    general_age = &data->state.sessionage;
  }

  /* find an empty slot for us, or find the oldest */
  for(i = 1; (i < data->set.general_ssl.max_ssl_sessions) &&
        data->state.session[i].sessionid; i++) {
    if(data->state.session[i].age < oldest_age) {
      oldest_age = data->state.session[i].age;
      store = &data->state.session[i];
    }
  }
  if(i == data->set.general_ssl.max_ssl_sessions)
    /* cache is full, we must "kill" the oldest entry! */
    Curl_ssl_kill_session(store);
  else
    store = &data->state.session[i]; /* use this slot */

  /* now init the session struct wisely */
  store->sessionid = ssl_sessionid;
  store->idsize = idsize;
  store->age = *general_age;    /* set current age */
  /* free it if there's one already present */
  free(store->name);
  free(store->conn_to_host);
  store->name = clone_host;               /* clone host name */
  store->conn_to_host = clone_conn_to_host; /* clone connect to host name */
  store->conn_to_port = conn_to_port; /* connect to port number */
  /* port number */
  store->remote_port = isProxy ? (int)conn->port : conn->remote_port;
  store->scheme = conn->handler->scheme;

  if(!Curl_clone_primary_ssl_config(ssl_config, &store->ssl_config)) {
    Curl_free_primary_ssl_config(&store->ssl_config);
    store->sessionid = NULL; /* let caller free sessionid */
    free(clone_host);
    free(clone_conn_to_host);
    return CURLE_OUT_OF_MEMORY;
  }

  if(added)
    *added = TRUE;

  DEBUGF(infof(data, "Added Session ID to cache for %s://%s:%d [%s]",
               store->scheme, store->name, store->remote_port,
               isProxy ? "PROXY" : "server"));
  return CURLE_OK;
}